

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSearchAsync(UpnpClient_Handle Hnd,int Mx,char *Target_const,void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int retVal;
  char *Target;
  Handle_Info *SInfo;
  void *Cookie_const_local;
  char *Target_const_local;
  UpnpClient_Handle local_10;
  int Mx_local;
  UpnpClient_Handle Hnd_local;
  
  Target = (char *)0x0;
  if (UpnpSdkInit == 1) {
    SInfo = (Handle_Info *)Cookie_const;
    Cookie_const_local = Target_const;
    Target_const_local._4_4_ = Mx;
    local_10 = Hnd;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x810,"Inside UpnpSearchAsync\n");
    HandleReadLock(".upnp/src/api/upnpapi.c",0x812);
    UVar1 = GetHandleInfo(local_10,(Handle_Info **)&Target);
    if (UVar1 == HND_CLIENT) {
      if (Target_const_local._4_4_ < 1) {
        Target_const_local._4_4_ = 5;
      }
      if (Target_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x81e);
        Mx_local = -0x65;
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x822);
        Mx_local = SearchByTarget(local_10,Target_const_local._4_4_,Target_const,SInfo);
        if (Mx_local == 1) {
          UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x82a,"Exiting UpnpSearchAsync \n");
          Mx_local = 0;
        }
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0x817);
      Mx_local = -100;
    }
  }
  else {
    Mx_local = -0x74;
  }
  return Mx_local;
}

Assistant:

int UpnpSearchAsync(UpnpClient_Handle Hnd,
	int Mx,
	const char *Target_const,
	const void *Cookie_const)
{
	struct Handle_Info *SInfo = NULL;
	char *Target = (char *)Target_const;
	int retVal;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpSearchAsync\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (Mx < 1)
		Mx = DEFAULT_MX;

	if (Target == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}

	HandleUnlock(__FILE__, __LINE__);
	retVal = SearchByTarget(Hnd, Mx, Target, (void *)Cookie_const);
	if (retVal != 1)
		return retVal;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSearchAsync \n");

	return UPNP_E_SUCCESS;
}